

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O0

void printMemOperand2(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  ushort uVar2;
  uint RegNo;
  MCOperand *op;
  int64_t iVar3;
  char *pcVar4;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar5;
  uint8_t *puVar6;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  cs_tms320c64x *tms320c64x;
  uint basereg;
  uint16_t offset;
  int64_t Val;
  MCOperand *Op;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar3 = MCOperand_getImm(op);
  RegNo = (uint)iVar3 & 0x7f;
  uVar2 = (ushort)(iVar3 >> 7) & 0x7fff;
  pcVar4 = getRegisterName(RegNo);
  SStream_concat(in_RDX,"*+%s[0x%x]",pcVar4,(ulong)uVar2);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    pcVar1 = in_RDI->flat_insn->detail;
    paVar5 = &pcVar1->field_6;
    puVar6 = pcVar1->groups + (ulong)(paVar5->x86).prefix[0] * 0x20 + 0x11;
    puVar6[0] = '\x03';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    *(uint *)((long)paVar5 + (ulong)(paVar5->x86).prefix[0] * 0x20 + 8) = RegNo;
    *(undefined4 *)((long)paVar5 + (ulong)(paVar5->x86).prefix[0] * 0x20 + 0x10) = 2;
    *(uint *)((long)paVar5 + (ulong)(paVar5->x86).prefix[0] * 0x20 + 0xc) = (uint)uVar2;
    *(undefined4 *)((long)paVar5 + (ulong)(paVar5->x86).prefix[0] * 0x20 + 0x18) = 1;
    *(undefined4 *)((long)paVar5 + (ulong)(paVar5->x86).prefix[0] * 0x20 + 0x1c) = 1;
    *(undefined4 *)((long)paVar5 + (ulong)(paVar5->x86).prefix[0] * 0x20 + 0x20) = 1;
    (paVar5->x86).prefix[0] = (paVar5->x86).prefix[0] + '\x01';
  }
  return;
}

Assistant:

static void printMemOperand2(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	int64_t Val = MCOperand_getImm(Op);
	uint16_t offset;
	unsigned basereg;
	cs_tms320c64x *tms320c64x;

	basereg = Val & 0x7f;
	offset = (Val >> 7) & 0x7fff;
	SStream_concat(O, "*+%s[0x%x]", getRegisterName(basereg), offset);

	if (MI->csh->detail) {
		tms320c64x = &MI->flat_insn->detail->tms320c64x;

		tms320c64x->operands[tms320c64x->op_count].type = TMS320C64X_OP_MEM;
		tms320c64x->operands[tms320c64x->op_count].mem.base = basereg;
		tms320c64x->operands[tms320c64x->op_count].mem.unit = 2;
		tms320c64x->operands[tms320c64x->op_count].mem.disp = offset;
		tms320c64x->operands[tms320c64x->op_count].mem.disptype = TMS320C64X_MEM_DISP_CONSTANT;
		tms320c64x->operands[tms320c64x->op_count].mem.direction = TMS320C64X_MEM_DIR_FW;
		tms320c64x->operands[tms320c64x->op_count].mem.modify = TMS320C64X_MEM_MOD_NO;
		tms320c64x->op_count++;
	}
}